

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void btSoftBody::PSolve_RContacts(btSoftBody *psb,btScalar kst,btScalar ti)

{
  btMatrix3x3 *m;
  uint uVar1;
  RContact *pRVar2;
  long lVar3;
  ulong uVar4;
  btRigidBody *this;
  btVector3 *v;
  ulong uVar5;
  float extraout_XMM0_Da;
  btScalar bVar6;
  float fVar7;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar8;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  btVector3 bVar13;
  btScalar dn;
  btVector3 impulse;
  float local_f0;
  float local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  btSoftBody *local_c0;
  btScalar local_b8;
  undefined1 local_a8 [16];
  btVector3 local_98;
  btScalar local_88;
  btScalar bStack_84;
  btScalar bStack_80;
  btScalar bStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  btVector3 local_40;
  
  local_a8 = ZEXT416((uint)(psb->m_sst).sdt);
  local_b8 = kst;
  (*((psb->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
  uVar1 = (psb->m_rcontacts).m_size;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  local_88 = local_b8;
  bStack_84 = local_b8;
  bStack_80 = local_b8;
  bStack_7c = local_b8;
  local_78 = (float)local_a8._0_4_;
  fStack_74 = (float)local_a8._0_4_;
  fStack_70 = (float)local_a8._0_4_;
  fStack_6c = (float)local_a8._0_4_;
  local_c0 = psb;
  for (; uVar4 * 0x78 - uVar5 != 0; uVar5 = uVar5 + 0x78) {
    pRVar2 = (psb->m_rcontacts).m_data;
    this = *(btRigidBody **)((long)(pRVar2->m_cti).m_normal.m_floats + (uVar5 - 8));
    if (((this->super_btCollisionObject).m_collisionFlags & 4) == 0) {
      if (((this->super_btCollisionObject).m_internalType & 2) == 0) {
        this = (btRigidBody *)0x0;
      }
      if (this == (btRigidBody *)0x0) {
        fVar8 = 0.0;
        local_e8 = 0;
        uStack_e0 = 0;
      }
      else {
        bVar13 = btRigidBody::getVelocityInLocalPoint
                           (this,(btVector3 *)((long)(pRVar2->m_c1).m_floats + uVar5));
        local_e8 = CONCAT44(bVar13.m_floats[1] * fStack_74,bVar13.m_floats[0] * local_78);
        uStack_e0 = CONCAT44(extraout_XMM0_Dd * fStack_6c,extraout_XMM0_Dc * fStack_70);
        fVar8 = bVar13.m_floats[2] * (float)local_a8._0_4_;
      }
      _local_d8 = ZEXT416((uint)fVar8);
      lVar3 = *(long *)((long)(pRVar2->m_c0).m_el[0].m_floats + (uVar5 - 8));
      bVar13 = operator-((btVector3 *)(lVar3 + 0x10),(btVector3 *)(lVar3 + 0x20));
      fVar8 = bVar13.m_floats[0] - (float)local_e8;
      fVar7 = bVar13.m_floats[1] - local_e8._4_4_;
      fVar9 = bVar13.m_floats[2] - (float)local_d8._0_4_;
      fVar10 = bVar13.m_floats[3] - (float)local_d8._4_4_;
      fVar11 = in_XMM1_Dc - fStack_d0;
      fVar12 = in_XMM1_Dd - fStack_cc;
      local_ec = *(float *)((long)(pRVar2->m_cti).m_normal.m_floats + uVar5 + 8) * fVar9 +
                 *(float *)((long)(pRVar2->m_cti).m_normal.m_floats + uVar5) * fVar8 +
                 fVar7 * *(float *)((long)(pRVar2->m_cti).m_normal.m_floats + uVar5 + 4);
      in_XMM1_Dc = 0.0;
      in_XMM1_Dd = 0.0;
      if (local_ec <= 1.1920929e-07) {
        v = (btVector3 *)((long)(pRVar2->m_cti).m_normal.m_floats + uVar5);
        local_d8._4_4_ = fVar7;
        local_d8._0_4_ = fVar8;
        fStack_d0 = extraout_XMM0_Dc_00 - (float)uStack_e0;
        fStack_cc = extraout_XMM0_Dd_00 - uStack_e0._4_4_;
        local_e8._0_4_ = fVar9;
        local_e8._4_4_ = fVar10;
        uStack_e0._0_4_ = fVar11;
        uStack_e0._4_4_ = fVar12;
        bVar6 = btVector3::dot((btVector3 *)
                               (*(long *)((long)(pRVar2->m_c0).m_el[0].m_floats + (uVar5 - 8)) +
                               0x10),v);
        fVar8 = bVar6 + *(float *)((long)(&(pRVar2->m_cti).m_normal + 1) + uVar5);
        if (extraout_XMM0_Da <= fVar8) {
          fVar8 = extraout_XMM0_Da;
        }
        bVar13 = operator*(v,&local_ec);
        local_58._8_4_ = extraout_XMM0_Dc_01;
        local_58._0_8_ = bVar13.m_floats._0_8_;
        local_58._12_4_ = extraout_XMM0_Dd_01;
        m = (btMatrix3x3 *)((long)(pRVar2->m_c0).m_el[0].m_floats + uVar5);
        fVar7 = m[1].m_el[1].m_floats[1];
        in_XMM1_Dc = 0.0;
        in_XMM1_Dd = 0.0;
        local_68 = ZEXT416((uint)fVar7);
        local_e8 = CONCAT44(local_e8._4_4_,
                            (float)local_e8 - ((float)local_e8 - bVar13.m_floats[2]) * fVar7);
        local_f0 = fVar8 * m[1].m_el[1].m_floats[2];
        bVar13 = operator*(v,&local_f0);
        local_98.m_floats[1] =
             (((float)local_d8._4_4_ -
              (float)local_68._0_4_ * ((float)local_d8._4_4_ - (float)local_58._4_4_)) +
             bVar13.m_floats[1]) * bStack_84;
        local_98.m_floats[0] =
             (((float)local_d8._0_4_ -
              (float)local_68._0_4_ * ((float)local_d8._0_4_ - (float)local_58._0_4_)) +
             bVar13.m_floats[0]) * local_88;
        local_98.m_floats[2] = (bVar13.m_floats[2] + (float)local_e8) * local_b8;
        local_98.m_floats[3] = 0.0;
        local_40 = operator*(m,&local_98);
        fVar8 = m[1].m_el[1].m_floats[0];
        local_98.m_floats[1] = fVar8 * local_40.m_floats[1];
        local_98.m_floats[0] = fVar8 * local_40.m_floats[0];
        local_98.m_floats[2] = fVar8 * local_40.m_floats[2];
        local_98.m_floats[3] = 0.0;
        btVector3::operator-=((btVector3 *)(*(long *)(m[-1].m_el[2].m_floats + 2) + 0x10),&local_98)
        ;
        psb = local_c0;
        if (this != (btRigidBody *)0x0) {
          btRigidBody::applyImpulse
                    (this,&local_40,(btVector3 *)((long)(pRVar2->m_c1).m_floats + uVar5));
          psb = local_c0;
        }
      }
    }
  }
  return;
}

Assistant:

void btSoftBody::PSolve_RContacts(btSoftBody* psb, btScalar kst, btScalar ti)
{
	const btScalar	dt = psb->m_sst.sdt;
	const btScalar	mrg = psb->getCollisionShape()->getMargin();
	for(int i=0,ni=psb->m_rcontacts.size();i<ni;++i)
	{
		const RContact&		c = psb->m_rcontacts[i];
		const sCti&			cti = c.m_cti;	
		if (cti.m_colObj->hasContactResponse()) 
		{
			btRigidBody* tmpRigid = (btRigidBody*)btRigidBody::upcast(cti.m_colObj);
			const btVector3		va = tmpRigid ? tmpRigid->getVelocityInLocalPoint(c.m_c1)*dt : btVector3(0,0,0);
			const btVector3		vb = c.m_node->m_x-c.m_node->m_q;	
			const btVector3		vr = vb-va;
			const btScalar		dn = btDot(vr, cti.m_normal);		
			if(dn<=SIMD_EPSILON)
			{
				const btScalar		dp = btMin( (btDot(c.m_node->m_x, cti.m_normal) + cti.m_offset), mrg );
				const btVector3		fv = vr - (cti.m_normal * dn);
				// c0 is the impulse matrix, c3 is 1 - the friction coefficient or 0, c4 is the contact hardness coefficient
				const btVector3		impulse = c.m_c0 * ( (vr - (fv * c.m_c3) + (cti.m_normal * (dp * c.m_c4))) * kst );
				c.m_node->m_x -= impulse * c.m_c2;
				if (tmpRigid)
					tmpRigid->applyImpulse(impulse,c.m_c1);
			}
		}
	}
}